

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O0

void do_reloc(NF_link_map *l,uniReloc *ur,ProxyRecord *records)

{
  uint uVar1;
  Elf64_Addr EVar2;
  Elf64_Addr EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  int iVar6;
  undefined8 uVar7;
  void *dest_1;
  undefined1 local_b8 [4];
  int res;
  rela_result result;
  NF_link_map **curr_search;
  void *dest;
  Elf64_Addr value;
  unsigned_long r_type;
  char *real_name;
  Elf64_Word name;
  Elf64_Sym *tmp_sym;
  Elf64_Xword idx;
  Elf64_Rela *it_1;
  char *strtab;
  Elf64_Sym *symtab;
  Elf64_Addr *tmp;
  Elf64_Rela *it;
  Elf64_Rela *end;
  Elf64_Rela *r_end;
  Elf64_Rela *r;
  ProxyRecord *records_local;
  uniReloc *ur_local;
  NF_link_map *l_local;
  
  tmp = (Elf64_Addr *)ur->start;
  idx = (Elf64_Xword)(tmp + ur->nrelative * 3);
  EVar2 = ur->start;
  EVar3 = ur->size;
  if (ur->nrelative != 0) {
    for (; tmp < idx; tmp = tmp + 3) {
      *(uint64_t *)(l->l_addr + *tmp) = l->l_addr + tmp[2];
    }
  }
  EVar4 = (l->l_info[6]->d_un).d_val;
  EVar5 = (l->l_info[5]->d_un).d_val;
  do {
    if (EVar2 + EVar3 <= idx) {
      return;
    }
    uVar1 = *(uint *)(EVar4 + (*(ulong *)(idx + 8) >> 0x20) * 0x18);
    if ((*(ulong *)(idx + 8) & 0xffffffff) == 0x25) {
      uVar7 = (*(code *)(l->l_addr + *(long *)(idx + 0x10)))();
      *(undefined8 *)(l->l_addr + *(long *)idx) = uVar7;
    }
    else {
      for (result.addr = (Elf64_Addr)l->l_search_list; *(long *)result.addr != 0;
          result.addr = result.addr + 8) {
        iVar6 = lookup_linkmap(*(NF_link_map **)result.addr,(char *)(EVar5 + uVar1),
                               (rela_result *)local_b8,records);
        if (iVar6 != 0) {
          *(long *)(l->l_addr + *(long *)idx) = (long)&(result.s)->st_name + *(long *)(idx + 0x10);
          break;
        }
      }
    }
    idx = idx + 0x18;
  } while( true );
}

Assistant:

static void do_reloc(struct NF_link_map *l, struct uniReloc *ur, const ProxyRecord *records)
{
    Elf64_Rela *r = (void *)ur->start;
    Elf64_Rela *r_end = r + ur->nrelative;
    Elf64_Rela *end = (void *)(ur->start + ur->size); //the end of .rel.dyn
    if (ur->nrelative)
    {
        /* do relative reloc here */

        /* start points to the beginning of .rel.dyn, and the thing in memory should be parsed as Rela entries */

        for (Elf64_Rela *it = r; it < r_end; it++)
        {
            Elf64_Addr *tmp = (void *)(l->l_addr + it->r_offset); //get the address we need to fill
            *tmp = l->l_addr + it->r_addend;                      //fill in the blank with rebased address
        }
    }

    /* currently, I only want to search libc.so */
    //void *handle = dlopen("libc.so.6", RTLD_LAZY);

    /* do actual reloc here */
    Elf64_Sym *symtab = (Elf64_Sym *)l->l_info[DT_SYMTAB]->d_un.d_ptr;
    const char *strtab = (const char *)l->l_info[DT_STRTAB]->d_un.d_ptr;
    for (Elf64_Rela *it = r_end; it < end; it++)
    {
        Elf64_Xword idx = it->r_info;
        Elf64_Sym *tmp_sym = &symtab[idx >> 32]; //from dynamic symbol table get the symbol
        Elf64_Word name = tmp_sym->st_name;
        const char *real_name = strtab + name; //from string table get the real name of the symbol

        const unsigned long int r_type = it->r_info & 0xffffffff;
        if (r_type == R_X86_64_IRELATIVE)
        {
            //the address for ifunc is l->l_addr + it->r_addend
            Elf64_Addr value = l->l_addr + it->r_addend;
            value = ((ElfW(Addr)(*)(void))value)();
            void *dest = (void *)(l->l_addr + it->r_offset);
            //pointing to the right address
            *(Elf64_Addr *)dest = value;
            continue;
        }

        struct NF_link_map **curr_search = l->l_search_list;
        while (*curr_search)
        {
            struct rela_result result;
            int res = lookup_linkmap((struct NF_link_map *)*curr_search, real_name, &result, records);
            if (res)
            {
                /* check different types and fix the address for rela entry here */
                /* two main types: JUMP_SLO and GLOB_DAT are in one case fallthrough, so we don't switch for now */
                void *dest = (void *)(l->l_addr + it->r_offset); //destination address to write
                *(Elf64_Addr *)dest = result.addr + it->r_addend;
                //dlclose(curr_search); //dlopened in NFdeps before
                break; //first hit wins
            }
            ++curr_search;
        }
    }
    //dlclose(handle);
}